

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O2

void __thiscall
flow::CondBrInstr::CondBrInstr
          (CondBrInstr *this,Value *cond,BasicBlock *trueBlock,BasicBlock *falseBlock)

{
  initializer_list<flow::Value_*> __l;
  allocator_type local_41;
  _Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_> local_40;
  Value *local_28;
  BasicBlock *local_20;
  BasicBlock *local_18;
  
  __l._M_len = 3;
  __l._M_array = &local_28;
  local_28 = cond;
  local_20 = trueBlock;
  local_18 = falseBlock;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector
            ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_40,__l,&local_41);
  TerminateInstr::TerminateInstr
            (&this->super_TerminateInstr,
             (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_40);
  std::_Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>::~_Vector_base(&local_40);
  (this->super_TerminateInstr).super_Instr.super_Value._vptr_Value =
       (_func_int **)&PTR__Instr_001b02c8;
  return;
}

Assistant:

CondBrInstr::CondBrInstr(Value* cond, BasicBlock* trueBlock, BasicBlock* falseBlock)
    : TerminateInstr({cond, trueBlock, falseBlock}) {}